

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(cmGlobalNinjaGenerator *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  
  cmGlobalCommonGenerator::cmGlobalCommonGenerator(&this->super_cmGlobalCommonGenerator,cm);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalNinjaGenerator_006ad6d8;
  p_Var1 = &(this->Rules)._M_t._M_impl.super__Rb_tree_header;
  this->BuildFileStream = (cmGeneratedFileStream *)0x0;
  this->RulesFileStream = (cmGeneratedFileStream *)0x0;
  this->CompileCommandsStream = (cmGeneratedFileStream *)0x0;
  *(undefined8 *)&(this->Rules)._M_t._M_impl = 0;
  *(undefined8 *)&(this->Rules)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->Rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Rules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header;
  (this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->CustomCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RuleCmdLength)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AllDependencies).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AllDependencies).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AllDependencies).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->UsingGCCOnWindows = false;
  (this->CustomCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CustomCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CustomCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ComputingUnknownDependencies = false;
  this->PolicyCMP0058 = WARN;
  p_Var1 = &(this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->CombinedCustomCommandExplicitDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CombinedBuildOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AssumedSourceDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NinjaCommand)._M_dataplus._M_p = (pointer)&(this->NinjaCommand).field_2;
  (this->NinjaCommand)._M_string_length = 0;
  (this->NinjaCommand).field_2._M_local_buf[0] = '\0';
  (this->NinjaVersion)._M_dataplus._M_p = (pointer)&(this->NinjaVersion).field_2;
  (this->NinjaVersion)._M_string_length = 0;
  (this->NinjaVersion).field_2._M_local_buf[0] = '\0';
  this->NinjaSupportsConsolePool = false;
  this->NinjaSupportsImplicitOuts = false;
  this->NinjaSupportsDyndeps = 0;
  (this->OutputPathPrefix)._M_dataplus._M_p = (pointer)&(this->OutputPathPrefix).field_2;
  (this->OutputPathPrefix)._M_string_length = 0;
  (this->OutputPathPrefix).field_2._M_local_buf[0] = '\0';
  (this->TargetAll)._M_dataplus._M_p = (pointer)&(this->TargetAll).field_2;
  (this->TargetAll)._M_string_length = 0;
  (this->TargetAll).field_2._M_local_buf[0] = '\0';
  (this->CMakeCacheFile)._M_dataplus._M_p = (pointer)&(this->CMakeCacheFile).field_2;
  (this->CMakeCacheFile)._M_string_length = 0;
  (this->CMakeCacheFile).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign
            ((char *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      FindMakeProgramFile);
  return;
}

Assistant:

cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(cmake* cm)
  : cmGlobalCommonGenerator(cm)
  , BuildFileStream(CM_NULLPTR)
  , RulesFileStream(CM_NULLPTR)
  , CompileCommandsStream(CM_NULLPTR)
  , Rules()
  , AllDependencies()
  , UsingGCCOnWindows(false)
  , ComputingUnknownDependencies(false)
  , PolicyCMP0058(cmPolicies::WARN)
  , NinjaSupportsConsolePool(false)
  , NinjaSupportsImplicitOuts(false)
  , NinjaSupportsDyndeps(0)
{
#ifdef _WIN32
  cm->GetState()->SetWindowsShell(true);
#endif
  // // Ninja is not ported to non-Unix OS yet.
  // this->ForceUnixPaths = true;
  this->FindMakeProgramFile = "CMakeNinjaFindMake.cmake";
}